

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::sf_store(Forth *this)

{
  double local_20;
  double x;
  Forth *pFStack_10;
  AAddr aaddr;
  Forth *this_local;
  
  pFStack_10 = this;
  requireDStackDepth(this,1,"SF!");
  requireFStackDepth(this,1,"SF!");
  x._4_4_ = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  local_20 = ForthStack<double>::getTop(&this->fStack);
  ForthStack<double>::pop(&this->fStack);
  setDataCell32(this,x._4_4_,&local_20);
  return;
}

Assistant:

void sf_store() {
			REQUIRE_DSTACK_DEPTH(1, "SF!");
			REQUIRE_FSTACK_DEPTH(1, "SF!");
			auto aaddr = AADDR(dStack.getTop()); pop();
			REQUIRE_ALIGNED(aaddr, "SF!");
			auto x = fStack.getTop(); fStack.pop();
			setDataCell32(aaddr, x);
		}